

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cast_expression.cpp
# Opt level: O3

unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true> __thiscall
duckdb::CastExpression::Copy(CastExpression *this)

{
  pointer pPVar1;
  CastExpression *this_00;
  pointer pCVar2;
  pointer *__ptr;
  long in_RSI;
  _Tuple_impl<0UL,_duckdb::ParsedExpression_*,_std::default_delete<duckdb::ParsedExpression>_>
  local_48;
  _Head_base<0UL,_duckdb::ParsedExpression_*,_false> local_40;
  _Head_base<0UL,_duckdb::CastExpression_*,_false> local_38;
  LogicalType local_30;
  
  pPVar1 = unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>
           ::operator->((unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>
                         *)(in_RSI + 0x38));
  (*(pPVar1->super_BaseExpression)._vptr_BaseExpression[0xc])(&local_48,pPVar1);
  this_00 = (CastExpression *)operator_new(0x60);
  LogicalType::LogicalType(&local_30,(LogicalType *)(in_RSI + 0x40));
  local_40._M_head_impl =
       (ParsedExpression *)
       local_48.super__Head_base<0UL,_duckdb::ParsedExpression_*,_false>._M_head_impl;
  local_48.super__Head_base<0UL,_duckdb::ParsedExpression_*,_false>._M_head_impl =
       (_Head_base<0UL,_duckdb::ParsedExpression_*,_false>)(ParsedExpression *)0x0;
  CastExpression(this_00,&local_30,
                 (unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>
                  *)&local_40,*(bool *)(in_RSI + 0x58));
  local_38._M_head_impl = this_00;
  if (local_40._M_head_impl != (ParsedExpression *)0x0) {
    (*((local_40._M_head_impl)->super_BaseExpression)._vptr_BaseExpression[1])();
  }
  local_40._M_head_impl = (ParsedExpression *)0x0;
  LogicalType::~LogicalType(&local_30);
  if (local_48.super__Head_base<0UL,_duckdb::ParsedExpression_*,_false>._M_head_impl !=
      (ParsedExpression *)0x0) {
    (**(code **)(*(long *)local_48.super__Head_base<0UL,_duckdb::ParsedExpression_*,_false>.
                          _M_head_impl + 8))();
  }
  pCVar2 = unique_ptr<duckdb::CastExpression,_std::default_delete<duckdb::CastExpression>,_true>::
           operator->((unique_ptr<duckdb::CastExpression,_std::default_delete<duckdb::CastExpression>,_true>
                       *)&local_38);
  (pCVar2->super_ParsedExpression).super_BaseExpression.type = *(ExpressionType *)(in_RSI + 8);
  (pCVar2->super_ParsedExpression).super_BaseExpression.expression_class =
       *(ExpressionClass *)(in_RSI + 9);
  ::std::__cxx11::string::_M_assign
            ((string *)&(pCVar2->super_ParsedExpression).super_BaseExpression.alias);
  (pCVar2->super_ParsedExpression).super_BaseExpression.query_location.index =
       *(idx_t *)(in_RSI + 0x30);
  (this->super_ParsedExpression).super_BaseExpression._vptr_BaseExpression =
       (_func_int **)local_38._M_head_impl;
  return (unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>_>)
         (unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>_>)this;
}

Assistant:

unique_ptr<ParsedExpression> CastExpression::Copy() const {
	auto copy = make_uniq<CastExpression>(cast_type, child->Copy(), try_cast);
	copy->CopyProperties(*this);
	return std::move(copy);
}